

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void __thiscall context::generate_labels(context *this)

{
  bool bVar1;
  bool bVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  local_88;
  undefined1 local_50 [8];
  string label;
  char *potential_label;
  anon_class_16_2_8ab8cb2f next_line;
  anon_class_8_1_8991fb9c advance;
  context *this_local;
  
  bVar2 = false;
  if (this->line == 0) {
    bVar2 = this->column == 0;
  }
  potential_label = (char *)this;
  next_line.this = this;
  next_line.advance.this = this;
  if (!bVar2) {
    __assert_fail("line == 0 && column == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/context.cpp"
                  ,0x115,"void context::generate_labels()");
  }
  this->pc = 8;
  while (*this->text != '\0') {
    bVar2 = is_alpha((int)*this->text);
    if (bVar2) {
      label.field_2._8_8_ = this->text;
      while( true ) {
        bVar1 = is_alnum((int)*this->text);
        bVar2 = true;
        if (!bVar1) {
          bVar2 = *this->text == '_';
        }
        if (!bVar2) break;
        generate_labels::anon_class_8_1_8991fb9c::operator()(&next_line.advance);
      }
      if (*this->text == ':') {
        std::__cxx11::string::string((string *)local_50);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   (char *)label.field_2._8_8_,(long)this->text - label.field_2._8_8_);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_&,_true>
                  (&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &this->pc);
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
        ::insert(&this->labels,&local_88);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
        ::~pair(&local_88);
        std::__cxx11::string::~string((string *)local_50);
      }
      generate_labels::anon_class_16_2_8ab8cb2f::operator()
                ((anon_class_16_2_8ab8cb2f *)&potential_label);
    }
    else {
      generate_labels::anon_class_16_2_8ab8cb2f::operator()
                ((anon_class_16_2_8ab8cb2f *)&potential_label);
    }
  }
  reset(this);
  return;
}

Assistant:

void context::generate_labels()
{
    const auto advance = [this] {
        if (*text == ';') {
            pc += 8;
            if (pc % 0x20 == 0) {
                pc += 8;
            }
        }
        next();
    };
    const auto next_line = [this, advance] {
        do {
            advance();
        } while (*text && column > 0);
    };

    assert(line == 0 && column == 0);

    pc = 8;

    while (*text) {
        if (!is_alpha(*text)) {
            next_line();
            continue;
        }
        const char* const potential_label = text;
        while (is_alnum(*text) || *text == '_') {
            advance();
        }
        if (*text == ':') {
            std::string label;
            label.append(potential_label, static_cast<size_t>(text - potential_label));
            labels.insert({std::move(label), pc});
        }
        next_line();
    }

    reset();
}